

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O2

any * __thiscall Omega_h::CallOp::eval(any *__return_storage_ptr__,CallOp *this,ExprEnv *env)

{
  Args *this_00;
  pointer psVar1;
  long *plVar2;
  iterator iVar3;
  iterator iVar4;
  ostream *poVar5;
  ParserFail *this_01;
  long lVar6;
  long lVar7;
  size_t i;
  ulong uVar8;
  string *__k;
  string local_1d8;
  stringstream ss;
  long local_1a8 [47];
  
  this_00 = &this->args;
  std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::resize
            (this_00,(long)(this->rhs).
                           super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->rhs).
                           super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4);
  lVar7 = 0;
  lVar6 = 0;
  uVar8 = 0;
  while( true ) {
    psVar1 = (this->rhs).
             super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->rhs).
                      super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar8)
    break;
    plVar2 = *(long **)((long)&(psVar1->
                               super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar7);
    (**(code **)(*plVar2 + 0x10))((storage_union *)&ss,plVar2,env);
    any::operator=((any *)((long)&((this_00->
                                   super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>).
                                   _M_impl.super__Vector_impl_data._M_start)->storage + lVar6),
                   (any *)&ss);
    if (local_1a8[0] != 0) {
      (**(code **)(local_1a8[0] + 8))((storage_union *)&ss);
    }
    uVar8 = uVar8 + 1;
    lVar6 = lVar6 + 0x18;
    lVar7 = lVar7 + 0x10;
  }
  __k = &this->name;
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::any>_>_>
                  *)env,__k);
  if ((_Rb_tree_header *)iVar3._M_node == &(env->variables)._M_t._M_impl.super__Rb_tree_header) {
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>_>_>_>
            ::find(&(env->functions)._M_t,__k);
    if ((_Rb_tree_header *)iVar4._M_node == &(env->functions)._M_t._M_impl.super__Rb_tree_header) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar5 = std::operator<<((ostream *)local_1a8,"\"");
      poVar5 = std::operator<<(poVar5,(string *)__k);
      std::operator<<(poVar5,"\" is neither a variable nor a function name\n");
      this_01 = (ParserFail *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      ParserFail::ParserFail(this_01,&local_1d8);
      __cxa_throw(this_01,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>::
    operator()(__return_storage_ptr__,
               (function<Omega_h::any_(std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>_&)>
                *)(iVar4._M_node + 2),this_00);
  }
  else {
    anon_unknown_41::access((char *)__return_storage_ptr__,env->size);
  }
  std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::clear(this_00);
  return __return_storage_ptr__;
}

Assistant:

any CallOp::eval(ExprEnv& env) {
  args.resize(rhs.size());
  for (std::size_t i = 0; i < rhs.size(); ++i) {
    args[i] = rhs[i]->eval(env);
  }
  auto vit = env.variables.find(name);
  if (vit == env.variables.end()) {
    /* function call */
    auto fit = env.functions.find(name);
    if (fit == env.functions.end()) {
      std::stringstream ss;
      ss << "\"" << name << "\" is neither a variable nor a function name\n";
      throw ParserFail(ss.str());
    }
    auto result = fit->second(args);
    args.clear();
    return result;
  } else {
    /* access operator for vector/matrix */
    auto& val = vit->second;
    auto result = access(env.size, env.dim, val, args);
    args.clear();
    return result;
  }
}